

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomStamp.cpp
# Opt level: O0

void __thiscall OpenMD::AtomStamp::validate(AtomStamp *this)

{
  bool bVar1;
  ParamConstraintFacade<OpenMD::NotEmptyConstraint> *this_00;
  undefined8 uVar2;
  long in_RDI;
  undefined8 in_R9;
  DataHolder *in_stack_00000140;
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff48;
  NotEmptyConstraint *in_stack_ffffffffffffff50;
  undefined1 *puVar3;
  undefined1 local_98 [32];
  string local_78 [48];
  string local_48 [72];
  
  DataHolder::validate(in_stack_00000140);
  bVar1 = ParameterBase::empty((ParameterBase *)(in_RDI + 0x68));
  if (!bVar1) {
    isNotEmpty();
    Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getData(in_stack_ffffffffffffff48);
    bVar1 = NotEmptyConstraint::operator()
                      (in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_48);
    NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x2e9e02);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ParameterBase::getKeyword_abi_cxx11_((ParameterBase *)(in_RDI + 0x68));
      this_00 = (ParamConstraintFacade<OpenMD::NotEmptyConstraint> *)std::__cxx11::string::c_str();
      puVar3 = local_98;
      isNotEmpty();
      ParamConstraintFacade<OpenMD::NotEmptyConstraint>::getConstraintDescription_abi_cxx11_
                (this_00);
      uVar2 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",this_00,uVar2,in_R9,
               this_00,puVar3);
      std::__cxx11::string::~string(local_78);
      NotEmptyConstraint::~NotEmptyConstraint((NotEmptyConstraint *)0x2e9e88);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void AtomStamp::validate() {
    DataHolder::validate();
    CheckParameter(Type, isNotEmpty());
  }